

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int run_test(int inprocess)

{
  int iVar1;
  undefined1 *puVar2;
  undefined8 *extraout_RDX;
  int iVar3;
  undefined1 *puVar4;
  undefined1 auVar5 [16];
  uv_thread_t tid;
  uv_process_t process;
  undefined1 auStack_a8 [8];
  undefined8 uStack_a0;
  undefined1 auStack_98 [8];
  uv_process_t local_90;
  
  puVar2 = auStack_98;
  puVar4 = auStack_98;
  if (inprocess == 0) {
    uStack_a0 = (code *)0x161ffc;
    spawn_helper(&ctx.channel,&local_90,"ipc_send_recv_helper");
    uStack_a0 = (code *)0x16200a;
    connect_cb(&ctx.connect_req,0);
LAB_0016200a:
    uStack_a0 = (code *)0x16200f;
    puVar2 = (undefined1 *)uv_default_loop();
    iVar3 = 0;
    uStack_a0 = (code *)0x162019;
    iVar1 = uv_run();
    if (iVar1 != 0) {
      uStack_a0 = (code *)0x162044;
      run_test_cold_3();
LAB_00162044:
      uStack_a0 = (code *)0x162049;
      run_test_cold_4();
LAB_00162049:
      uStack_a0 = (code *)0x16204e;
      run_test_cold_1();
      goto LAB_0016204e;
    }
    if (recv_cb_count != 2) goto LAB_00162044;
    if (inprocess == 0) {
      return 0;
    }
    uStack_a0 = (code *)0x162032;
    iVar1 = uv_thread_join();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar3 = 0x161f29;
    uStack_a0 = (code *)0x161f8e;
    iVar1 = uv_thread_create(auStack_98,ipc_send_recv_helper_threadproc,0x2a);
    if (iVar1 != 0) goto LAB_00162049;
    uStack_a0 = (code *)0x161fa0;
    uv_sleep(1000);
    uStack_a0 = (code *)0x161fa5;
    puVar2 = (undefined1 *)uv_default_loop();
    iVar3 = 0x2e6330;
    uStack_a0 = (code *)0x161fb9;
    iVar1 = uv_pipe_init(puVar2,&ctx,1);
    if (iVar1 == 0) {
      uStack_a0 = (code *)0x161fe2;
      uv_pipe_connect(0x2e6438,&ctx,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0016200a;
    }
LAB_0016204e:
    puVar4 = puVar2;
    uStack_a0 = (code *)0x162053;
    run_test_cold_2();
  }
  uStack_a0 = connect_cb;
  run_test_cold_5();
  if ((uv_connect_t *)puVar4 == &ctx.connect_req) {
    if (iVar3 != 0) goto LAB_00162128;
    _auStack_a8 = uv_buf_init(".",1);
    iVar1 = uv_write2(0x2e6498,&ctx,auStack_a8,1,0x2e6620,0);
    if (iVar1 != 0) goto LAB_0016212d;
    auVar5 = uv_buf_init(".",1);
    _auStack_a8 = auVar5;
    iVar1 = uv_write2(0x2e6558,&ctx,auStack_a8,1,0x2e6758,0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start(&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162137;
    }
  }
  else {
    connect_cb_cold_1();
LAB_00162128:
    connect_cb_cold_2();
LAB_0016212d:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_00162137:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return 0x2e6b04;
}

Assistant:

int run_test(const char* test,
             int benchmark_output,
             int test_count) {
  char errmsg[1024] = "";
  process_info_t processes[1024];
  process_info_t *main_proc;
  task_entry_t* task;
  int process_count;
  int result;
  int status;
  int i;

  status = 255;
  main_proc = NULL;
  process_count = 0;

#ifndef _WIN32
  /* Clean up stale socket from previous run. */
  remove(TEST_PIPENAME);
  remove(TEST_PIPENAME_2);
  remove(TEST_PIPENAME_3);
#endif

  /* If it's a helper the user asks for, start it directly. */
  for (task = TASKS; task->main; task++) {
    if (task->is_helper && strcmp(test, task->process_name) == 0) {
      return task->main();
    }
  }

  /* Start the helpers first. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    /* Skip the test itself. */
    if (!task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      1 /* is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    process_count++;
  }

  /* Now start the test itself. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    if (task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      0 /* !is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    main_proc = &processes[process_count];
    process_count++;
    break;
  }

  if (main_proc == NULL) {
    snprintf(errmsg,
             sizeof errmsg,
             "No test with that name: %s",
             test);
    goto out;
  }

  result = process_wait(main_proc, 1, task->timeout);
  if (result == -1) {
    FATAL("process_wait failed");
  } else if (result == -2) {
    /* Don't have to clean up the process, process_wait() has killed it. */
    snprintf(errmsg,
             sizeof errmsg,
             "timeout");
    goto out;
  }

  status = process_reap(main_proc);
  if (status != TEST_OK) {
    snprintf(errmsg,
             sizeof errmsg,
             "exit code %d",
             status);
    goto out;
  }

  if (benchmark_output) {
    /* Give the helpers time to clean up their act. */
    uv_sleep(1000);
  }

out:
  /* Reap running processes except the main process, it's already dead. */
  for (i = 0; i < process_count - 1; i++) {
    process_terminate(&processes[i]);
  }

  if (process_count > 0 &&
      process_wait(processes, process_count - 1, -1) < 0) {
    FATAL("process_wait failed");
  }

  log_tap_result(test_count, test, status, &processes[i]);

  /* Show error and output from processes if the test failed. */
  if ((status != TEST_OK && status != TEST_SKIP) || task->show_output) {
    if (strlen(errmsg) > 0)
      fprintf(stderr, "# %s\n", errmsg);
    fprintf(stderr, "# ");
    fflush(stderr);

    for (i = 0; i < process_count; i++) {
      switch (process_output_size(&processes[i])) {
       case -1:
        fprintf(stderr, "Output from process `%s`: (unavailable)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       case 0:
        fprintf(stderr, "Output from process `%s`: (no output)\n",
                process_get_name(&processes[i]));
        fflush(stderr);
        break;

       default:
        fprintf(stderr, "Output from process `%s`:\n", process_get_name(&processes[i]));
        fflush(stderr);
        process_copy_output(&processes[i], stderr);
        break;
      }
    }

  /* In benchmark mode show concise output from the main process. */
  } else if (benchmark_output) {
    switch (process_output_size(main_proc)) {
     case -1:
      fprintf(stderr, "%s: (unavailable)\n", test);
      fflush(stderr);
      break;

     case 0:
      fprintf(stderr, "%s: (no output)\n", test);
      fflush(stderr);
      break;

     default:
      for (i = 0; i < process_count; i++) {
        process_copy_output(&processes[i], stderr);
      }
      break;
    }
  }

  /* Clean up all process handles. */
  for (i = 0; i < process_count; i++) {
    process_cleanup(&processes[i]);
  }

  return status;
}